

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void jumpscopeerror(LexState *ls,Labeldesc *gt)

{
  Vardesc *pVVar1;
  char *msg_00;
  char *msg;
  char *varname;
  Labeldesc *gt_local;
  LexState *ls_local;
  
  pVVar1 = getlocalvardesc(ls->fs,(uint)gt->nactvar);
  msg_00 = luaO_pushfstring(ls->L,"<goto %s> at line %d jumps into the scope of local \'%s\'",
                            gt->name->contents,(ulong)(uint)gt->line,((pVVar1->vd).name)->contents);
  luaK_semerror(ls,msg_00);
}

Assistant:

static l_noret jumpscopeerror (LexState *ls, Labeldesc *gt) {
  const char *varname = getstr(getlocalvardesc(ls->fs, gt->nactvar)->vd.name);
  const char *msg = "<goto %s> at line %d jumps into the scope of local '%s'";
  msg = luaO_pushfstring(ls->L, msg, getstr(gt->name), gt->line, varname);
  luaK_semerror(ls, msg);  /* raise the error */
}